

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionNextChar.cpp
# Opt level: O0

void __thiscall
Hpipe::InstructionNextChar::InstructionNextChar(InstructionNextChar *this,Context *cx,bool beg)

{
  Context local_90;
  byte local_19;
  Context *pCStack_18;
  bool beg_local;
  Context *cx_local;
  InstructionNextChar *this_local;
  
  local_19 = beg;
  pCStack_18 = cx;
  cx_local = (Context *)this;
  Context::Context(&local_90,cx);
  Instruction::Instruction(&this->super_Instruction,&local_90);
  Context::~Context(&local_90);
  (this->super_Instruction)._vptr_Instruction = (_func_int **)&PTR__InstructionNextChar_002903c0;
  (this->super_Instruction).field_0x174 = local_19 & 1;
  return;
}

Assistant:

InstructionNextChar::InstructionNextChar( const Context &cx, bool beg ) : Instruction( cx ), beg( beg ) {
}